

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O0

int pixel_filter_helper(fitsfile **fptr,char *outfile,char *expr,int *status)

{
  int iVar1;
  int iVar2;
  int *in_RCX;
  int *status_00;
  long in_RDX;
  long *in_RDI;
  int singleHDU;
  int hdunum;
  int ii;
  char *DEFAULT_TAG;
  PixelFilter filter;
  int *in_stack_00000288;
  PixelFilter *in_stack_00000290;
  int *in_stack_00000788;
  char *in_stack_00000790;
  fitsfile **in_stack_00000798;
  undefined4 in_stack_fffffffffffffee8;
  int morekeys;
  int in_stack_fffffffffffffef0;
  fitsfile *infptr;
  undefined4 local_100 [4];
  undefined1 *local_f0;
  char *local_e0;
  int local_d8;
  long local_c8;
  int *in_stack_ffffffffffffff40;
  int *in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff54;
  fitsfile *in_stack_ffffffffffffff58;
  char *local_20;
  int local_4;
  
  memset(local_100,0,0xd8);
  infptr = (fitsfile *)0x27027e;
  morekeys = 0;
  local_100[0] = 1;
  local_f0 = &stack0xfffffffffffffef8;
  iVar1 = ffinit(in_stack_00000798,in_stack_00000790,in_stack_00000788);
  if (iVar1 < 1) {
    ffghdn((fitsfile *)*in_RDI,(int *)&stack0xfffffffffffffef0);
    local_20 = (char *)(in_RDX + 3);
    status_00 = (int *)(ulong)((int)*local_20 - 0x42);
    switch(status_00) {
    case (int *)0x0:
    case (int *)0x20:
      local_d8 = 8;
      break;
    case (int *)0x2:
    case (int *)0x22:
      local_d8 = -0x40;
      break;
    case (int *)0x7:
    case (int *)0x27:
      local_d8 = 0x10;
      break;
    case (int *)0x8:
    case (int *)0x28:
      local_d8 = 0x20;
      break;
    case (int *)0x10:
    case (int *)0x30:
      local_d8 = -0x20;
    }
    if (local_d8 != 0) {
      local_20 = (char *)(in_RDX + 4);
    }
    if (*local_20 == '1') {
      local_20 = local_20 + 1;
      morekeys = 1;
    }
    if (*(int *)(*(long *)(*in_RDI + 8) + 0x1c) != 0) {
      morekeys = 1;
    }
    if (*local_20 != ' ') {
      ffpmsg((char *)0x112475);
      ffpmsg((char *)0x112482);
    }
    for (; *local_20 == ' '; local_20 = local_20 + 1) {
    }
    for (iVar1 = 1; morekeys == 0 && iVar1 < in_stack_fffffffffffffef0; iVar1 = iVar1 + 1) {
      ffmahd(in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,in_stack_ffffffffffffff48,
             in_stack_ffffffffffffff40);
      iVar2 = ffcopy(infptr,(fitsfile *)CONCAT44(iVar1,in_stack_fffffffffffffef0),morekeys,status_00
                    );
      if (0 < iVar2) {
        ffclos((fitsfile *)CONCAT44(morekeys,in_stack_fffffffffffffee8),status_00);
        return *in_RCX;
      }
    }
    ffmahd(in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,in_stack_ffffffffffffff48,
           in_stack_ffffffffffffff40);
    local_e0 = local_20;
    iVar2 = fits_pixel_filter(in_stack_00000290,in_stack_00000288);
    iVar1 = in_stack_fffffffffffffef0;
    if (iVar2 == 0) {
      while ((iVar1 = iVar1 + 1, morekeys == 0 &&
             (iVar2 = ffmahd(in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                             in_stack_ffffffffffffff48,in_stack_ffffffffffffff40), iVar2 < 1))) {
        ffcopy(infptr,(fitsfile *)CONCAT44(iVar1,in_stack_fffffffffffffef0),morekeys,status_00);
      }
      if (*in_RCX == 0x6b) {
        *in_RCX = 0;
      }
      else if (0 < *in_RCX) {
        ffclos((fitsfile *)CONCAT44(morekeys,in_stack_fffffffffffffee8),status_00);
        return *in_RCX;
      }
      ffclos((fitsfile *)CONCAT44(morekeys,in_stack_fffffffffffffee8),status_00);
      *in_RDI = local_c8;
      if (iVar1 + -1 != in_stack_fffffffffffffef0) {
        ffmahd(in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,in_stack_ffffffffffffff48,
               in_stack_ffffffffffffff40);
      }
      local_4 = *in_RCX;
    }
    else {
      ffpmsg((char *)0x1125a6);
      ffpmsg((char *)0x1125b3);
      ffclos((fitsfile *)CONCAT44(morekeys,in_stack_fffffffffffffee8),status_00);
      local_4 = *in_RCX;
    }
  }
  else {
    ffpmsg((char *)0x11234a);
    ffpmsg((char *)0x112357);
    local_4 = *in_RCX;
  }
  return local_4;
}

Assistant:

int pixel_filter_helper(
           fitsfile **fptr,  /* IO - pointer to input image; on output it  */
                             /*      points to the new image */
           char *outfile,    /* I - name for output file        */
           char *expr,       /* I - Image filter expression    */
           int *status)
{
	PixelFilter filter = { 0 };
	char * DEFAULT_TAG = "X";
	int ii, hdunum;
        int singleHDU = 0;

	filter.count = 1;
	filter.ifptr = fptr;
	filter.tag = &DEFAULT_TAG;

    /* create new empty file for result */
    if (ffinit(&filter.ofptr, outfile, status) > 0)
    {
        ffpmsg("failed to create output file for pixel filter:");
        ffpmsg(outfile);
        return(*status);
    }

    fits_get_hdu_num(*fptr, &hdunum);  /* current HDU number in input file */

    expr += 3; /* skip 'pix' */
    switch (expr[0]) {
       case 'b': 
       case 'B': filter.bitpix = BYTE_IMG; break;
       case 'i':
       case 'I': filter.bitpix = SHORT_IMG; break;
       case 'j':
       case 'J': filter.bitpix = LONG_IMG; break;
       case 'r':
       case 'R': filter.bitpix = FLOAT_IMG; break;
       case 'd':
       case 'D': filter.bitpix = DOUBLE_IMG; break;
    }
    if (filter.bitpix) /* skip bitpix indicator */
       ++expr;

    if (*expr == '1') {
       ++expr;
       singleHDU = 1;
    }

    if (((*fptr)->Fptr)->only_one)
       singleHDU = 1;

    if (*expr != ' ') {
       ffpmsg("pixel filtering expression not space separated:");
       ffpmsg(expr);
    }
    while (*expr == ' ')
       ++expr;

    /* copy all preceding extensions to the output file */
    for (ii = 1; !singleHDU && ii < hdunum; ii++)
    {
        fits_movabs_hdu(*fptr, ii, NULL, status);
        if (fits_copy_hdu(*fptr, filter.ofptr, 0, status) > 0)
        {
            ffclos(filter.ofptr, status);
            return(*status);
        }
    }

    /* move back to the original HDU position */
    fits_movabs_hdu(*fptr, hdunum, NULL, status);

	filter.expression = expr;
    if (fits_pixel_filter(&filter, status)) {
        ffpmsg("failed to execute image filter:");
        ffpmsg(expr);
        ffclos(filter.ofptr, status);
        return(*status);
    }


    /* copy any remaining HDUs to the output file */

    for (ii = hdunum + 1; !singleHDU; ii++)
    {
        if (fits_movabs_hdu(*fptr, ii, NULL, status) > 0)
            break;

        fits_copy_hdu(*fptr, filter.ofptr, 0, status);
    }

    if (*status == END_OF_FILE)   
        *status = 0;              /* got the expected EOF error; reset = 0  */
    else if (*status > 0)
    {
        ffclos(filter.ofptr, status);
        return(*status);
    }

    /* close the original file and return ptr to the new image */
    ffclos(*fptr, status);

    *fptr = filter.ofptr; /* reset the pointer to the new table */

    /* move back to the image subsection */
    if (ii - 1 != hdunum)
        fits_movabs_hdu(*fptr, hdunum, NULL, status);

    return(*status);
}